

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O0

void ensure_solid_xref(hd_context *ctx,pdf_document *doc,int num,int which)

{
  hd_error_stack_slot *phVar1;
  pdf_xref_subsec *ppVar2;
  uchar uVar3;
  unsigned_short uVar4;
  hd_off_t hVar5;
  int iVar6;
  pdf_xref *ppVar7;
  pdf_xref_subsec *ppVar8;
  pdf_xref_entry *ppVar9;
  pdf_xref_entry *ppVar10;
  int local_44;
  int i;
  pdf_xref_subsec *next;
  pdf_xref_subsec *new_sub;
  pdf_xref_subsec *sub;
  pdf_xref *xref;
  int which_local;
  int num_local;
  pdf_document *doc_local;
  hd_context *ctx_local;
  
  ppVar7 = doc->xref_sections + which;
  ppVar8 = ppVar7->subsec;
  xref._4_4_ = num;
  if (num < ppVar7->num_objects) {
    xref._4_4_ = ppVar7->num_objects;
  }
  if ((((ppVar8 == (pdf_xref_subsec *)0x0) || (ppVar8->next != (pdf_xref_subsec *)0x0)) ||
      (ppVar8->start != 0)) || (ppVar8->len < xref._4_4_)) {
    ppVar8 = (pdf_xref_subsec *)hd_calloc(ctx,1,0x18);
    iVar6 = hd_push_try(ctx);
    if ((iVar6 != 0) && (iVar6 = __sigsetjmp(ctx->error->top->buffer,0), iVar6 == 0)) {
      ppVar9 = (pdf_xref_entry *)hd_calloc(ctx,(long)xref._4_4_,0x20);
      ppVar8->table = ppVar9;
      ppVar8->start = 0;
      ppVar8->len = xref._4_4_;
      ppVar8->next = (pdf_xref_subsec *)0x0;
    }
    phVar1 = ctx->error->top;
    ctx->error->top = phVar1 + -1;
    if (1 < phVar1->code) {
      hd_free(ctx,ppVar8);
      hd_rethrow(ctx);
    }
    new_sub = ppVar7->subsec;
    while (new_sub != (pdf_xref_subsec *)0x0) {
      ppVar2 = new_sub->next;
      for (local_44 = 0; local_44 < new_sub->len; local_44 = local_44 + 1) {
        ppVar9 = ppVar8->table + (local_44 + new_sub->start);
        ppVar10 = new_sub->table + local_44;
        uVar3 = ppVar10->flags;
        uVar4 = ppVar10->gen;
        iVar6 = ppVar10->num;
        ppVar9->type = ppVar10->type;
        ppVar9->flags = uVar3;
        ppVar9->gen = uVar4;
        ppVar9->num = iVar6;
        hVar5 = ppVar10->stm_ofs;
        ppVar9->ofs = ppVar10->ofs;
        ppVar9->stm_ofs = hVar5;
        ppVar9->stm_buf = ppVar10->stm_buf;
        ppVar9->obj = ppVar10->obj;
      }
      hd_free(ctx,new_sub->table);
      hd_free(ctx,new_sub);
      new_sub = ppVar2;
    }
    ppVar7->num_objects = xref._4_4_;
    ppVar7->subsec = ppVar8;
    if (doc->max_xref_len < xref._4_4_) {
      extend_xref_index(ctx,doc,xref._4_4_);
    }
  }
  return;
}

Assistant:

static void
ensure_solid_xref(hd_context *ctx, pdf_document *doc, int num, int which)
{
	pdf_xref *xref = &doc->xref_sections[which];
	pdf_xref_subsec *sub = xref->subsec;
	pdf_xref_subsec *new_sub;

	if (num < xref->num_objects)
		num = xref->num_objects;

	if (sub != NULL && sub->next == NULL && sub->start == 0 && sub->len >= num)
		return;

	new_sub = hd_malloc_struct(ctx, pdf_xref_subsec);
	hd_try(ctx)
	{
		new_sub->table = hd_calloc(ctx, num, sizeof(pdf_xref_entry));
		new_sub->start = 0;
		new_sub->len = num;
		new_sub->next = NULL;
	}
	hd_catch(ctx)
	{
		hd_free(ctx, new_sub);
		hd_rethrow(ctx);
	}

	/* Move objects over to the new subsection and destroy the old
	 * ones */
	sub = xref->subsec;
	while (sub != NULL)
	{
		pdf_xref_subsec *next = sub->next;
		int i;

		for (i = 0; i < sub->len; i++)
		{
			new_sub->table[i+sub->start] = sub->table[i];
		}
		hd_free(ctx, sub->table);
		hd_free(ctx, sub);
		sub = next;
	}
	xref->num_objects = num;
	xref->subsec = new_sub;
	if (doc->max_xref_len < num)
		extend_xref_index(ctx, doc, num);
}